

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int get_next_job(TileDataEnc *tile_data,int *current_mi_row,int mib_size)

{
  bool bVar1;
  int mi_row_end;
  AV1EncRowMultiThreadSync *row_mt_sync;
  int mib_size_local;
  int *current_mi_row_local;
  TileDataEnc *tile_data_local;
  uint local_4;
  
  bVar1 = (tile_data->row_mt_sync).next_mi_row < (tile_data->tile_info).mi_row_end;
  if (bVar1) {
    *current_mi_row = (tile_data->row_mt_sync).next_mi_row;
    (tile_data->row_mt_sync).num_threads_working = (tile_data->row_mt_sync).num_threads_working + 1;
    (tile_data->row_mt_sync).next_mi_row = mib_size + (tile_data->row_mt_sync).next_mi_row;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static inline int get_next_job(TileDataEnc *const tile_data,
                               int *current_mi_row, int mib_size) {
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;
  const int mi_row_end = tile_data->tile_info.mi_row_end;

  if (row_mt_sync->next_mi_row < mi_row_end) {
    *current_mi_row = row_mt_sync->next_mi_row;
    row_mt_sync->num_threads_working++;
    row_mt_sync->next_mi_row += mib_size;
    return 1;
  }
  return 0;
}